

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O0

void __thiscall
PoolList<Server::Private::ListenerImpl>::clear(PoolList<Server::Private::ListenerImpl> *this)

{
  Item *end;
  Item *i;
  PoolList<Server::Private::ListenerImpl> *this_local;
  
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    Server::Private::ListenerImpl::~ListenerImpl((ListenerImpl *)(end + 1));
    end->prev = this->freeItem;
    this->freeItem = end;
  }
  (this->_begin).item = &this->endItem;
  (this->endItem).prev = (Item *)0x0;
  this->_size = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      ((T*)(i + 1))->~T();
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }